

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

void __thiscall
txpackage_tests::package_witness_swap_tests::test_method(package_witness_swap_tests *this)

{
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  *this_00;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  *this_01;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  CKey input_signing_key_02;
  CKey input_signing_key_03;
  CScript output_destination;
  CScript output_destination_00;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  element_type *peVar8;
  bool bVar9;
  readonly_property<bool> rVar10;
  CScript *pCVar11;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar12;
  Chainstate *pCVar13;
  Txid *pTVar14;
  int64_t iVar15;
  CAmount CVar16;
  const_iterator cVar17;
  const_iterator cVar18;
  const_iterator cVar19;
  const_iterator cVar20;
  uint256 *puVar21;
  int64_t iVar22;
  CFeeRate *pCVar23;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *pvVar24;
  size_type sVar25;
  iterator pvVar26;
  CTxMemPool *pCVar27;
  CKey *pCVar28;
  Txid *pTVar29;
  iterator pvVar30;
  PackageMempoolAcceptResult *pPVar31;
  CMutableTransaction *client_maxfeerate;
  CKey *pCVar32;
  CKey *pCVar33;
  Wtxid *pWVar34;
  long lVar35;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  const_string file_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  initializer_list<transaction_identifier<true>_> __l_06;
  const_string file_25;
  const_string file_26;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  CTransactionRef input_transaction_02;
  CTransactionRef input_transaction_03;
  check_type cVar37;
  undefined4 in_stack_fffffffffffff20c;
  undefined4 uVar36;
  undefined8 in_stack_fffffffffffff210;
  undefined8 in_stack_fffffffffffff218;
  undefined8 in_stack_fffffffffffff220;
  CAmount in_stack_fffffffffffff228;
  undefined1 submit;
  undefined8 in_stack_fffffffffffff230;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  char *local_d98;
  assertion_result local_d90;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  CFeeRate expected_feerate;
  char *local_cf0;
  char *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  expected_wtxids;
  undefined1 *local_bd8;
  undefined1 *local_bd0;
  char *local_bc8;
  char *local_bc0;
  CTransactionRef ptx_mixed_child;
  CKey mixed_grandchild_key;
  char *local_b98;
  pointer local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  undefined1 *local_b58;
  undefined1 *local_b50;
  char *local_b48;
  char *local_b40;
  CTransactionRef ptx_parent3;
  CKey local_b28;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_b18;
  CMutableTransaction mtx_parent3;
  char *local_ad0;
  char *local_ac8;
  undefined1 *local_ac0;
  undefined1 *local_ab8;
  char *local_ab0;
  char *local_aa8;
  CTransactionRef ptx_parent2_v2;
  CTransactionRef ptx_parent2_v1;
  CMutableTransaction mtx_parent2_v2;
  CMutableTransaction mtx_parent2_v1;
  CTransactionRef ptx_grandparent2;
  CKey local_a00;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_9f0;
  CMutableTransaction mtx_grandparent2;
  CScriptWitness parent2_witness2;
  CScriptWitness parent2_witness1;
  CTransactionRef ptx_parent1;
  CKey local_958;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_948;
  CScriptWitness acs_witness;
  Package package_mixed;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  CTransactionRef ptx_grandchild;
  CKey local_830;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_820;
  CKey grandchild_key;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  CTransactionRef ptx_child2;
  CTransactionRef ptx_child1;
  CMutableTransaction mtx_child2;
  CMutableTransaction mtx_child1;
  CKey child_key;
  CScriptWitness witness2;
  CScriptWitness witness1;
  CTransactionRef ptx_parent;
  CKey local_510;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_500;
  CMutableTransaction mtx_parent;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_mixed;
  CMutableTransaction mtx_mixed_child;
  CScript mixed_child_spk;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_428;
  MempoolAcceptResult parent2_v2_result;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_328;
  CScript grandparent2_spk;
  CScript grandparent2_script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_2c8;
  CMutableTransaction mtx_parent1;
  CScript acs_spk;
  CScript acs_script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_230;
  CMutableTransaction mtx_grandchild;
  CScript grandchild_locking_script;
  PackageMempoolAcceptResult submit_segwit_dedup;
  PackageMempoolAcceptResult submit_witness2;
  CScript child_locking_script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_98;
  CScript scriptPubKey;
  CScript witnessScript;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestChain100Setup::mineBlocks((TestChain100Setup *)this,5);
  parent2_v2_result.m_result_type = 5000;
  parent2_v2_result._4_4_ = 0;
  TestChain100Setup::MockMempoolMinFee((TestChain100Setup *)this,(CFeeRate *)&parent2_v2_result);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock18,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
             ,0x1f6,false);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)0x0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length = 0;
  parent2_v2_result.m_result_type = VALID;
  parent2_v2_result._4_4_ = 0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  pCVar11 = CScript::operator<<((CScript *)&parent2_v2_result,OP_DROP);
  ppVar12 = &CScript::operator<<(pCVar11,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&witnessScript.super_CScriptBase,ppVar12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&parent2_v2_result);
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&submit_witness2,&witnessScript);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)submit_witness2.m_state.super_ValidationState<PackageValidationResult>.
                  m_reject_reason._M_string_length;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2._M_allocated_capacity;
  parent2_v2_result.m_result_type =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode;
  parent2_v2_result._4_4_ =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_result;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
  _M_local_buf[8] = '\x04';
  GetScriptForDestination(&scriptPubKey,(CTxDestination *)&parent2_v2_result);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&parent2_v2_result);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_500,
             &((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  pCVar33 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey;
  CKey::CKey(&local_510,pCVar33);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_98,&scriptPubKey.super_CScriptBase);
  pCVar28 = &local_510;
  pvVar26 = (iterator)0x0;
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key._0_8_ = &local_98;
  auVar5._4_8_ = in_stack_fffffffffffff210;
  auVar5._0_4_ = in_stack_fffffffffffff20c;
  auVar5._12_8_ = in_stack_fffffffffffff218;
  auVar5._20_8_ = in_stack_fffffffffffff220;
  auVar5._28_4_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_500;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,(TestChain100Setup *)this,input_transaction,0,(int)pCVar28,
             input_signing_key,(CScript)(auVar5 << 0x20),in_stack_fffffffffffff228,
             SUB81(in_stack_fffffffffffff230,0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_98);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_510.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_500._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_parent);
  witness1.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  witness1.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  witness1.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parent2_v2_result.m_result_type = INVALID;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&witness1.stack,(int *)&parent2_v2_result);
  parent2_v2_result._0_8_ = witnessScript.super_CScriptBase._union.indirect_contents.indirect;
  if (witnessScript.super_CScriptBase._size < 0x1d) {
    parent2_v2_result._0_8_ = &witnessScript;
  }
  sVar25 = witnessScript.super_CScriptBase._size - 0x1d;
  if (witnessScript.super_CScriptBase._size < 0x1d) {
    sVar25 = witnessScript.super_CScriptBase._size;
  }
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       (long)&(((CScript *)parent2_v2_result._0_8_)->super_CScriptBase)._union + (long)(int)sVar25;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&witness1,(iterator *)&parent2_v2_result,(iterator *)&submit_witness2);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&witness2.stack,&witness1.stack);
  parent2_v2_result.m_result_type = MEMPOOL_ENTRY;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&witness2.stack,(int *)&parent2_v2_result);
  parent2_v2_result._0_8_ = &witnessScript;
  if (0x1c < witnessScript.super_CScriptBase._size) {
    parent2_v2_result._0_8_ = witnessScript.super_CScriptBase._union.indirect_contents.indirect;
  }
  sVar25 = witnessScript.super_CScriptBase._size - 0x1d;
  if (0x1c >= witnessScript.super_CScriptBase._size) {
    sVar25 = witnessScript.super_CScriptBase._size;
  }
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       (long)&(((CScript *)parent2_v2_result._0_8_)->super_CScriptBase)._union + (long)(int)sVar25;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&witness2,(iterator *)&parent2_v2_result,(iterator *)&submit_witness2);
  GenerateRandomKey(SUB81(&child_key,0));
  CKey::GetPubKey((CPubKey *)&submit_witness2,&child_key);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)&submit_segwit_dedup,(CPubKey *)&submit_witness2);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p._0_4_ = (undefined4)
               submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason._M_string_length;
  parent2_v2_result.m_result_type =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_mode;
  parent2_v2_result._4_4_ =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_result;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
  _M_local_buf[8] = '\x05';
  GetScriptForDestination(&child_locking_script,(CTxDestination *)&parent2_v2_result);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&parent2_v2_result);
  CMutableTransaction::CMutableTransaction(&mtx_child1);
  mtx_child1.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&mtx_child1.vin,1);
  uVar2 = *(undefined8 *)
           ((ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)
           (((ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)
           (((ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   (((mtx_child1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) =
       *(undefined8 *)
        (((ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   (((mtx_child1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar4;
  *(undefined8 *)
   ((mtx_child1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
   _M_elems = uVar2;
  *(undefined8 *)
   (((mtx_child1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar3;
  ((mtx_child1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
   ._M_start)->prevout).n = 0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)0x0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length = 0;
  parent2_v2_result.m_result_type = VALID;
  parent2_v2_result._4_4_ = 0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((mtx_child1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&parent2_v2_result);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&parent2_v2_result);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((mtx_child1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&witness1.stack);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&mtx_child1.vout,1);
  (mtx_child1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 4800000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((mtx_child1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &child_locking_script.super_CScriptBase);
  CMutableTransaction::CMutableTransaction(&mtx_child2,&mtx_child1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((mtx_child2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&witness2.stack);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_child1);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_child2);
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = &pCVar28->fCompressed;
  msg.m_begin = pvVar26;
  file.m_end = (iterator)0x21f;
  file.m_begin = (iterator)&local_600;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_610,msg);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
       parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ &
       0xffffffffffffff00;
  parent2_v2_result._0_8_ = &PTR__lazy_ostream_01139f30;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = boost::unit_test::lazy_ostream::inst;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length = (long)"\x05\x04\x03\x02\x01" + 5;
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_618 = "";
  pTVar29 = &(ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->hash;
  pTVar14 = &(ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->hash;
  uVar36 = 0;
  pvVar26 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
            (&parent2_v2_result,&local_620,0x21f,1,2,pTVar29,0xc633cf,pTVar14,0xc633e5);
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pTVar29;
  msg_00.m_begin = pvVar26;
  file_00.m_end = (iterator)0x221;
  file_00.m_begin = (iterator)&local_630;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_640,
             msg_00);
  bVar9 = transaction_identifier<true>::operator!=
                    (&(ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_witness_hash,
                     &(ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_witness_hash);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_ = bVar9;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = (pointer)0x0;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = 0;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       anon_var_dwarf_124d8b2;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p = "";
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
       parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ &
       0xffffffffffffff00;
  parent2_v2_result._0_8_ = &PTR__lazy_ostream_0113a070;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = boost::unit_test::lazy_ostream::inst;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_648 = "";
  pvVar26 = &DAT_00000001;
  pvVar30 = (iterator)0x0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length = (size_type)&submit_segwit_dedup;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&submit_witness2,(lazy_ostream *)&parent2_v2_result,1,0,WARN,
             (check_type)pTVar14,(size_t)&local_650,0x221);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
              ._M_string_length);
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar30;
  msg_01.m_begin = pvVar26;
  file_01.m_end = (iterator)0x223;
  file_01.m_begin = (iterator)&local_660;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_670,
             msg_01);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&submit_witness2,
             &ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
              ._M_string_length,
             &ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)&submit_witness2;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&mtx_parent2_v1,__l,(allocator_type *)&mtx_mixed_child);
  GetPackageHash((uint256 *)&parent2_v2_result,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&mtx_parent2_v1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&mtx_grandchild,
             &ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&mtx_grandchild;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&mtx_parent2_v2,__l_00,(allocator_type *)&err_mixed);
  GetPackageHash((uint256 *)&submit_segwit_dedup,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&mtx_parent2_v2);
  bVar9 = ::operator!=((base_blob<256U> *)&parent2_v2_result,(base_blob<256U> *)&submit_segwit_dedup
                      );
  mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar9);
  mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mtx_parent1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&mtx_parent3;
  mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_124d8bf;
  mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc6348c;
  mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_678 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_grandparent2,(lazy_ostream *)&mtx_parent1,1,0,WARN,
             (check_type)pTVar14,(size_t)&local_680,0x223);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&mtx_parent2_v2);
  lVar35 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar35));
    lVar35 = lVar35 + -0x10;
  } while (lVar35 != -8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&mtx_parent2_v1);
  lVar35 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode
               + lVar35));
    lVar35 = lVar35 + -0x10;
  } while (lVar35 != -8);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&parent2_v2_result,
             &ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason,
             &ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&parent2_v2_result;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&mtx_grandparent2,__l_01,(allocator_type *)&submit_witness2);
  lVar35 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&parent2_v2_result.m_result_type + lVar35));
    lVar35 = lVar35 + -0x10;
  } while (lVar35 != -8);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pPVar31 = &submit_witness2;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
          _M_dataplus._M_p & 0xffffffffffffff00;
  ProcessNewPackage((PackageMempoolAcceptResult *)&parent2_v2_result,pCVar13,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
                    (Package *)&mtx_grandparent2,false,(optional<CFeeRate> *)pPVar31);
  pCVar27 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit_witness2,(Package *)&mtx_grandparent2,
             (PackageMempoolAcceptResult *)&parent2_v2_result,true,pCVar27);
  if (submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
      ._M_local_buf[8] == '\x01') {
    local_690 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_688 = "";
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = (iterator)pPVar31;
    msg_02.m_begin = (iterator)pCVar27;
    file_02.m_end = (iterator)0x22c;
    file_02.m_begin = (iterator)&local_690;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6a0,
               msg_02);
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
        field_2._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00550577;
    }
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_01139e30;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_6b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6a8 = "";
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&submit_witness2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_grandchild,(lazy_ostream *)&submit_segwit_dedup,1,1,WARN,
               (check_type)pTVar14,(size_t)&local_6b0,0x22c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit_witness2);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&submit_witness2,
             &ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
              ._M_string_length,
             &ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&submit_witness2;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&mtx_parent2_v1,__l_02,(allocator_type *)&submit_segwit_dedup);
  lVar35 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode
               + lVar35));
    lVar35 = lVar35 + -0x10;
  } while (lVar35 != -8);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pPVar31 = &submit_segwit_dedup;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  ProcessNewPackage(&submit_witness2,pCVar13,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
                    (Package *)&mtx_parent2_v1,false,(optional<CFeeRate> *)pPVar31);
  pCVar27 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit_segwit_dedup,(Package *)&mtx_parent2_v1,&submit_witness2,true,pCVar27);
  if (submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
      field_2._M_local_buf[8] == '\x01') {
    local_6c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6b8 = "";
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = (iterator)pPVar31;
    msg_03.m_begin = (iterator)pCVar27;
    file_03.m_end = (iterator)0x234;
    file_03.m_begin = (iterator)&local_6c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6d0,
               msg_03);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
        field_2._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00550577;
    }
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139e30;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_6e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6d8 = "";
    mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&submit_segwit_dedup;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_parent1,(lazy_ostream *)&mtx_grandchild,1,1,WARN,
               (check_type)pTVar14,(size_t)&local_6e0,0x234);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    cVar17 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_witness2.m_tx_results._M_t,
                    &((ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_witness_hash).m_wrapped);
    cVar18 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_witness2.m_tx_results._M_t,
                    &((ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_witness_hash).m_wrapped);
    local_6f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6e8 = "";
    local_700 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = (iterator)pPVar31;
    msg_04.m_begin = (iterator)pCVar27;
    file_04.m_end = (iterator)0x238;
    file_04.m_begin = (iterator)&local_6f0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_700,
               msg_04);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,cVar17._M_node[2]._M_color == 2);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d8da;
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc634e7;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_parent2_v2;
    local_710 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_708 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_parent1,(lazy_ostream *)&mtx_grandchild,1,0,WARN,
               (check_type)pTVar14,(size_t)&local_710,0x238);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_720 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_718 = "";
    local_730 = &boost::unit_test::basic_cstring<char_const>::null;
    local_728 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar30;
    msg_05.m_begin = pvVar26;
    file_05.m_end = (iterator)0x239;
    file_05.m_begin = (iterator)&local_720;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_730,
               msg_05);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,cVar18._M_node[2]._M_color == 3);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d8f5;
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc6353d;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_parent2_v2;
    local_740 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_738 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_parent1,(lazy_ostream *)&mtx_grandchild,1,0,WARN,
               (check_type)pTVar14,(size_t)&local_740,0x239);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_750 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_748 = "";
    local_760 = &boost::unit_test::basic_cstring<char_const>::null;
    local_758 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar30;
    msg_06.m_begin = pvVar26;
    file_06.m_end = (iterator)0x23a;
    file_06.m_begin = (iterator)&local_750;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_760,
               msg_06);
    peVar8 = ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xc694e1;
    local_770 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_768 = "";
    pTVar14 = (Txid *)std::optional<uint256>::value
                                ((optional<uint256> *)&cVar18._M_node[7]._M_right);
    uVar36 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,uint256>
              (&mtx_grandchild,&local_770,0x23a,1,2,&peVar8->m_witness_hash,0xc6353e,pTVar14,
               0xc6355b);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit_segwit_dedup);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate = &mtx_grandchild;
  mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_grandchild.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                        .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ProcessNewPackage(&submit_segwit_dedup,pCVar13,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
                    (Package *)&mtx_grandparent2,false,(optional<CFeeRate> *)client_maxfeerate);
  pCVar27 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_grandchild,(Package *)&mtx_grandparent2,&submit_segwit_dedup,true,pCVar27);
  if ((char)mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish == '\x01') {
    local_780 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_778 = "";
    local_790 = &boost::unit_test::basic_cstring<char_const>::null;
    local_788 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = (iterator)client_maxfeerate;
    msg_07.m_begin = (iterator)pCVar27;
    file_07.m_end = (iterator)0x242;
    file_07.m_begin = (iterator)&local_780;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_790,
               msg_07);
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((char)mtx_grandchild.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00550577;
    }
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139e30;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_7a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_798 = "";
    mtx_parent1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_grandchild;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_parent2_v2,(lazy_ostream *)&mtx_parent1,1,1,WARN,
               (check_type)pTVar14,(size_t)&local_7a0,0x242);
  }
  else {
    cVar17 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_segwit_dedup.m_tx_results._M_t,
                    &((ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_witness_hash).m_wrapped);
    cVar18 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&submit_segwit_dedup.m_tx_results._M_t,
                    &((ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_witness_hash).m_wrapped);
    local_7b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7a8 = "";
    local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = (iterator)client_maxfeerate;
    msg_08.m_begin = (iterator)pCVar27;
    file_08.m_end = (iterator)0x246;
    file_08.m_begin = (iterator)&local_7b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_7c0,
               msg_08);
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar17._M_node[2]._M_color == 2);
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d92a;
    mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc635d8;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_parent3;
    local_7d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7c8 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_parent2_v2,(lazy_ostream *)&mtx_parent1,1,0,WARN,
               (check_type)pTVar14,(size_t)&local_7d0,0x246);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_7e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7d8 = "";
    local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = pvVar30;
    msg_09.m_begin = pvVar26;
    file_09.m_end = (iterator)0x247;
    file_09.m_begin = (iterator)&local_7e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_7f0,
               msg_09);
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar18._M_node[2]._M_color == 2);
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d937;
    mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc6362d;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
    mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx_parent1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&mtx_parent3;
    local_800 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7f8 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_parent2_v2,(lazy_ostream *)&mtx_parent1,1,0,WARN,
               (check_type)pTVar14,(size_t)&local_800,0x247);
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_grandchild);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_segwit_dedup);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_witness2);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&mtx_parent2_v1);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult
            ((PackageMempoolAcceptResult *)&parent2_v2_result);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&mtx_grandparent2);
  GenerateRandomKey(SUB81(&grandchild_key,0));
  CKey::GetPubKey((CPubKey *)&submit_witness2,&grandchild_key);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)&submit_segwit_dedup,(CPubKey *)&submit_witness2);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p._0_4_ = (undefined4)
               submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason._M_string_length;
  parent2_v2_result.m_result_type =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_mode;
  parent2_v2_result._4_4_ =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_result;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
  _M_local_buf[8] = '\x05';
  GetScriptForDestination(&grandchild_locking_script,(CTxDestination *)&parent2_v2_result);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&parent2_v2_result);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_820,
             &ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_830,&child_key);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_230,&grandchild_locking_script.super_CScriptBase);
  _cVar37 = 4700000000;
  pCVar28 = &local_830;
  pvVar26 = (iterator)0x0;
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x118244f00;
  input_signing_key_00._0_8_ = &local_230;
  auVar6._4_8_ = in_stack_fffffffffffff210;
  auVar6._0_4_ = uVar36;
  auVar6._12_8_ = pCVar33;
  auVar6._20_8_ = in_stack_fffffffffffff220;
  auVar6._28_4_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_820;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_grandchild,(TestChain100Setup *)this,input_transaction_00,0,(int)pCVar28,
             input_signing_key_00,(CScript)(auVar6 << 0x20),in_stack_fffffffffffff228,
             SUB81(in_stack_fffffffffffff230,0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_230);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_830.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_820._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_grandchild);
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = &pCVar28->fCompressed;
  msg_10.m_begin = pvVar26;
  file_10.m_end = (iterator)0x25a;
  file_10.m_begin = (iterator)&local_850;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_860,
             msg_10);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&submit_witness2,
             &ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason
              ._M_string_length,
             &ptx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&submit_witness2;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&mtx_parent2_v2,__l_03,(allocator_type *)&err_mixed);
  GetPackageHash((uint256 *)&parent2_v2_result,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&mtx_parent2_v2);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&mtx_parent1,
             &ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &ptx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&mtx_parent1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&mtx_parent3,__l_04,(allocator_type *)&acs_script);
  GetPackageHash((uint256 *)&submit_segwit_dedup,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&mtx_parent3);
  bVar9 = ::operator!=((base_blob<256U> *)&parent2_v2_result,(base_blob<256U> *)&submit_segwit_dedup
                      );
  mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar9);
  mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d944;
  mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc6368a;
  mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_grandparent2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&mtx_mixed_child;
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_868 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mtx_parent2_v1,(lazy_ostream *)&mtx_grandparent2,1,0,WARN,_cVar37,
             (size_t)&local_870,0x25a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&mtx_parent3);
  lVar35 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&mtx_parent1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar35));
    lVar35 = lVar35 + -0x10;
  } while (lVar35 != -8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&mtx_parent2_v2);
  lVar35 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode
               + lVar35));
    lVar35 = lVar35 + -0x10;
  } while (lVar35 != -8);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&parent2_v2_result,
             &ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason,
             &ptx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&parent2_v2_result;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&mtx_parent1,__l_05,(allocator_type *)&submit_witness2);
  lVar35 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&parent2_v2_result.m_result_type + lVar35));
    submit = (undefined1)in_stack_fffffffffffff230;
    lVar35 = lVar35 + -0x10;
  } while (lVar35 != -8);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pPVar31 = &submit_witness2;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
          _M_dataplus._M_p & 0xffffffffffffff00;
  ProcessNewPackage((PackageMempoolAcceptResult *)&parent2_v2_result,pCVar13,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(Package *)&mtx_parent1,
                    false,(optional<CFeeRate> *)pPVar31);
  pCVar27 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit_witness2,(Package *)&mtx_parent1,
             (PackageMempoolAcceptResult *)&parent2_v2_result,true,pCVar27);
  if (submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
      ._M_local_buf[8] == '\x01') {
    local_880 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_878 = "";
    local_890 = &boost::unit_test::basic_cstring<char_const>::null;
    local_888 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = (iterator)pPVar31;
    msg_11.m_begin = (iterator)pCVar27;
    file_11.m_end = (iterator)0x261;
    file_11.m_begin = (iterator)&local_880;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_890,
               msg_11);
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
        field_2._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00550577;
    }
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_01139e30;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_8a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_898 = "";
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&submit_witness2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_grandparent2,(lazy_ostream *)&submit_segwit_dedup,1,1,WARN,
               _cVar37,(size_t)&local_8a0,0x261);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_00 = (_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)((long)&parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.
                         m_debug_message.field_2 + 8);
    cVar17 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(this_00,&((ptx_child2.
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->m_witness_hash).m_wrapped);
    cVar18 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(this_00,&((ptx_grandchild.
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->m_witness_hash).m_wrapped);
    local_8b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_8a8 = "";
    local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = (iterator)pPVar31;
    msg_12.m_begin = (iterator)pCVar27;
    file_12.m_end = (iterator)0x265;
    file_12.m_begin = (iterator)&local_8b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_8c0,
               msg_12);
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar17._M_node[2]._M_color == 3);
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d95f;
    mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc636e8;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_8d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_8c8 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&mtx_parent2_v1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_grandparent2,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               _cVar37,(size_t)&local_8d0,0x265);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_8e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_8d8 = "";
    local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar30;
    msg_13.m_begin = pvVar26;
    file_13.m_end = (iterator)0x266;
    file_13.m_begin = (iterator)&local_8e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_8f0,
               msg_13);
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           cVar18._M_node[2]._M_color == _S_red);
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d97a;
    mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xc63736;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_900 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_8f8 = "";
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&mtx_parent2_v1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&mtx_grandparent2,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               _cVar37,(size_t)&local_900,0x266);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &mtx_grandparent2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pCVar28 = pCVar33;
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit_witness2);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult
            ((PackageMempoolAcceptResult *)&parent2_v2_result);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&mtx_parent1);
  package_mixed.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_mixed.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_mixed.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)0x0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length = 0;
  parent2_v2_result.m_result_type = VALID;
  parent2_v2_result._4_4_ = 0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  ppVar12 = &CScript::operator<<((CScript *)&parent2_v2_result,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&acs_script.super_CScriptBase,ppVar12)
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&parent2_v2_result);
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&submit_witness2,&acs_script);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)submit_witness2.m_state.super_ValidationState<PackageValidationResult>.
                  m_reject_reason._M_string_length;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2._M_allocated_capacity;
  parent2_v2_result.m_result_type =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode;
  parent2_v2_result._4_4_ =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_result;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
  _M_local_buf[8] = '\x04';
  GetScriptForDestination(&acs_spk,(CTxDestination *)&parent2_v2_result);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&parent2_v2_result);
  acs_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parent2_v2_result._0_8_ = &acs_script;
  if (0x1c < acs_script.super_CScriptBase._size) {
    parent2_v2_result._0_8_ = acs_script.super_CScriptBase._union.indirect_contents.indirect;
  }
  acs_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  acs_witness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar25 = acs_script.super_CScriptBase._size - 0x1d;
  if (0x1c >= acs_script.super_CScriptBase._size) {
    sVar25 = acs_script.super_CScriptBase._size;
  }
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       (long)&(((CScript *)parent2_v2_result._0_8_)->super_CScriptBase)._union + (long)(int)sVar25;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&acs_witness,(iterator *)&parent2_v2_result,(iterator *)&submit_witness2);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_948,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_958,pCVar33);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_2c8,&acs_spk.super_CScriptBase)
  ;
  input_signing_key_01.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_01._0_8_ = &local_2c8;
  output_destination.super_CScriptBase._union._4_4_ = uVar36;
  output_destination.super_CScriptBase._union._0_4_ = 1;
  output_destination.super_CScriptBase._union._8_8_ = in_stack_fffffffffffff210;
  output_destination.super_CScriptBase._union._16_8_ = pCVar28;
  output_destination.super_CScriptBase._24_8_ = in_stack_fffffffffffff220;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_948;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent1,(TestChain100Setup *)this,input_transaction_01,0,(int)&local_958,
             input_signing_key_01,output_destination,in_stack_fffffffffffff228,(bool)submit);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_2c8);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_958.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_948._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_parent1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_mixed,&ptx_parent1);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)0x0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length = 0;
  parent2_v2_result.m_result_type = VALID;
  parent2_v2_result._4_4_ = 0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  pCVar11 = CScript::operator<<((CScript *)&parent2_v2_result,OP_DROP);
  ppVar12 = &CScript::operator<<(pCVar11,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&grandparent2_script.super_CScriptBase,ppVar12);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&parent2_v2_result);
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)&submit_witness2,&grandparent2_script);
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)submit_witness2.m_state.super_ValidationState<PackageValidationResult>.
                  m_reject_reason._M_string_length;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2._M_allocated_capacity;
  parent2_v2_result.m_result_type =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode;
  parent2_v2_result._4_4_ =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_result;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
       submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
  _M_local_buf[8] = '\x04';
  GetScriptForDestination(&grandparent2_spk,(CTxDestination *)&parent2_v2_result);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&parent2_v2_result);
  parent2_witness1.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parent2_witness1.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parent2_witness1.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parent2_v2_result.m_result_type = INVALID;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&parent2_witness1.stack,(int *)&parent2_v2_result);
  parent2_v2_result._0_8_ = grandparent2_script.super_CScriptBase._union.indirect_contents.indirect;
  if (grandparent2_script.super_CScriptBase._size < 0x1d) {
    parent2_v2_result._0_8_ = &grandparent2_script;
  }
  sVar25 = grandparent2_script.super_CScriptBase._size - 0x1d;
  if (grandparent2_script.super_CScriptBase._size < 0x1d) {
    sVar25 = grandparent2_script.super_CScriptBase._size;
  }
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       (long)&(((CScript *)parent2_v2_result._0_8_)->super_CScriptBase)._union + (long)(int)sVar25;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&parent2_witness1,(iterator *)&parent2_v2_result,(iterator *)&submit_witness2);
  parent2_witness2.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parent2_witness2.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parent2_witness2.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parent2_v2_result.m_result_type = MEMPOOL_ENTRY;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&parent2_witness2.stack,(int *)&parent2_v2_result);
  parent2_v2_result._0_8_ = &grandparent2_script;
  if (0x1c < grandparent2_script.super_CScriptBase._size) {
    parent2_v2_result._0_8_ =
         grandparent2_script.super_CScriptBase._union.indirect_contents.indirect;
  }
  sVar25 = grandparent2_script.super_CScriptBase._size - 0x1d;
  if (0x1c >= grandparent2_script.super_CScriptBase._size) {
    sVar25 = grandparent2_script.super_CScriptBase._size;
  }
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       (long)&(((CScript *)parent2_v2_result._0_8_)->super_CScriptBase)._union + (long)(int)sVar25;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&parent2_witness2,(iterator *)&parent2_v2_result,(iterator *)&submit_witness2);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_9f0,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_a00,pCVar33);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_328,&grandparent2_spk.super_CScriptBase);
  _cVar37 = 4900000000;
  pCVar32 = &local_a00;
  pvVar26 = (iterator)0x0;
  input_signing_key_02.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_02._0_8_ = &local_328;
  output_destination_00.super_CScriptBase._union._4_4_ = uVar36;
  output_destination_00.super_CScriptBase._union._0_4_ = 1;
  output_destination_00.super_CScriptBase._union._8_8_ = in_stack_fffffffffffff210;
  output_destination_00.super_CScriptBase._union._16_8_ = pCVar28;
  output_destination_00.super_CScriptBase._24_8_ = in_stack_fffffffffffff220;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_9f0;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_grandparent2,(TestChain100Setup *)this,input_transaction_02,0,(int)pCVar32,
             input_signing_key_02,output_destination_00,in_stack_fffffffffffff228,(bool)submit);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_328);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_a00.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9f0._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>
            ((CMutableTransaction *)&ptx_grandparent2);
  CMutableTransaction::CMutableTransaction(&mtx_parent2_v1);
  mtx_parent2_v1.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&mtx_parent2_v1.vin,1);
  uVar2 = *(undefined8 *)
           ((ptx_grandparent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)
           (((ptx_grandparent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)
           (((ptx_grandparent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   (((mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) =
       *(undefined8 *)
        (((ptx_grandparent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   (((mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar4;
  *(undefined8 *)
   ((mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
   _M_elems = uVar2;
  *(undefined8 *)
   (((mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar3;
  ((mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start)->prevout).n = 0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
  _M_p = (pointer)0x0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
  _M_string_length = 0;
  parent2_v2_result.m_result_type = VALID;
  parent2_v2_result._4_4_ = 0;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  parent2_v2_result.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&parent2_v2_result);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&parent2_v2_result);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((mtx_parent2_v1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&parent2_witness1.stack);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&mtx_parent2_v1.vout,1);
  (mtx_parent2_v1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 4800000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((mtx_parent2_v1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &acs_spk.super_CScriptBase);
  CMutableTransaction::CMutableTransaction(&mtx_parent2_v2,&mtx_parent2_v1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((mtx_parent2_v2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&parent2_witness2.stack);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_parent2_v1);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_parent2_v2);
  ChainstateManager::ProcessTransaction
            (&parent2_v2_result,
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&ptx_parent2_v2,false);
  local_ab0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_aa8 = "";
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = &pCVar32->fCompressed;
  msg_14.m_begin = pvVar26;
  file_14.m_end = (iterator)0x29f;
  file_14.m_begin = (iterator)&local_ab0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_ac0,
             msg_14);
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p = (pointer)0x0;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = 0;
  mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_124d987;
  mtx_parent3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc63780;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
          _M_dataplus._M_p & 0xffffffffffffff00;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_parent3;
  local_ad0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_ac8 = "";
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_ =
       parent2_v2_result.m_result_type == VALID;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&submit_segwit_dedup,(lazy_ostream *)&submit_witness2,1,0,WARN,
             _cVar37,(size_t)&local_ad0,0x29f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_string_length);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_mixed,&ptx_parent2_v1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b18,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CKey::CKey(&local_b28,pCVar33);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_428,&acs_spk.super_CScriptBase)
  ;
  _cVar37 = 0x12a05f138;
  pCVar33 = &local_b28;
  pvVar26 = (iterator)0x0;
  input_signing_key_03.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f138;
  input_signing_key_03._0_8_ = &local_428;
  auVar7._4_8_ = in_stack_fffffffffffff210;
  auVar7._0_4_ = uVar36;
  auVar7._12_8_ = pCVar28;
  auVar7._20_8_ = in_stack_fffffffffffff220;
  auVar7._28_4_ = 0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_b18;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent3,(TestChain100Setup *)this,input_transaction_03,0,(int)pCVar33,
             input_signing_key_03,(CScript)(auVar7 << 0x20),in_stack_fffffffffffff228,(bool)submit);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_428);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_b28.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b18._M_refcount);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_parent3);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_mixed,&ptx_parent3);
  local_b48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_b40 = "";
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = &pCVar33->fCompressed;
  msg_15.m_begin = pvVar26;
  file_15.m_end = (iterator)0x2a9;
  file_15.m_begin = (iterator)&local_b48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_b58,
             msg_15);
  err_mixed.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       CTxMemPool::GetMinFee
                 ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                  super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool.
                  _M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  iVar15 = GetVirtualTransactionSize
                     (ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  CVar16 = CFeeRate::GetFee((CFeeRate *)&err_mixed,(uint32_t)iVar15);
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_ =
       200 < CVar16;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p = (pointer)0x0;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = 0;
  mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d9ad;
  mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc637da;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
          _M_dataplus._M_p & 0xffffffffffffff00;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_mixed_child;
  local_b68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_b60 = "";
  pvVar26 = &DAT_00000001;
  pvVar30 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&submit_segwit_dedup,(lazy_ostream *)&submit_witness2,1,0,WARN,
             _cVar37,(size_t)&local_b68,0x2a9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_string_length);
  local_b78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_b70 = "";
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar30;
  msg_16.m_begin = pvVar26;
  file_16.m_end = (iterator)0x2aa;
  file_16.m_begin = (iterator)&local_b78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_b88,
             msg_16);
  pCVar27 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  iVar15 = GetVirtualTransactionSize
                     (ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  CVar16 = CFeeRate::GetFee(&(pCVar27->m_opts).min_relay_feerate,(uint32_t)iVar15);
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_ =
       CVar16 < 0xc9;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p = (pointer)0x0;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = 0;
  mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_124d9ba;
  mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc63842;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
          _M_dataplus._M_p & 0xffffffffffffff00;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_0113a070;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_mixed_child;
  local_b98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_b90 = (pointer)0xc61ecf;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&submit_segwit_dedup,(lazy_ostream *)&submit_witness2,1,0,WARN,
             _cVar37,(size_t)&local_b98,0x2aa);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.
              m_reject_reason._M_string_length);
  GenerateRandomKey(SUB81(&mixed_grandchild_key,0));
  CKey::GetPubKey((CPubKey *)&submit_segwit_dedup,&mixed_grandchild_key);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)&mtx_mixed_child,(CPubKey *)&submit_segwit_dedup);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(submit_witness2.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = (pointer)mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  submit_witness2.m_tx_results._M_t._M_impl._0_1_ = 5;
  GetScriptForDestination(&mixed_child_spk,(CTxDestination *)&submit_witness2);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&submit_witness2);
  CMutableTransaction::CMutableTransaction(&mtx_mixed_child);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       *(undefined8 *)
        ((ptx_parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = *(pointer *)
           (((ptx_parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       *(size_type *)
        (((ptx_parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       *(undefined8 *)
        (((ptx_parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_mixed_child.vin,(COutPoint *)&submit_witness2);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       *(undefined8 *)
        ((ptx_parent2_v1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = *(pointer *)
           (((ptx_parent2_v1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       *(size_type *)
        (((ptx_parent2_v1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       *(undefined8 *)
        (((ptx_parent2_v1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_mixed_child.vin,(COutPoint *)&submit_witness2);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       *(undefined8 *)
        ((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
  ._M_p = *(pointer *)
           (((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       *(size_type *)
        (((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       *(undefined8 *)
        (((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx_mixed_child.vin,(COutPoint *)&submit_witness2);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&acs_witness.stack);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start[1].scriptWitness.stack,&acs_witness.stack);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&mtx_mixed_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start[2].scriptWitness.stack,&acs_witness.stack);
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_mode = 0x663a5200;
  submit_witness2.m_state.super_ValidationState<PackageValidationResult>.m_result =
       PCKG_MEMPOOL_ERROR;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx_mixed_child.vout,(long *)&submit_witness2
             ,&mixed_child_spk);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx_mixed_child)
  ;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package_mixed,&ptx_mixed_child);
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pPVar31 = &submit_segwit_dedup;
  submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  ProcessNewPackage(&submit_witness2,pCVar13,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_mixed,false,
                    (optional<CFeeRate> *)pPVar31);
  pCVar27 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (&err_mixed,&package_mixed,&submit_witness2,true,pCVar27);
  if (err_mixed.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_bc8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_bc0 = "";
    local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_17.m_end = (iterator)pPVar31;
    msg_17.m_begin = (iterator)pCVar27;
    file_17.m_end = (iterator)0x2c3;
    file_17.m_begin = (iterator)&local_bc8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_bd8,
               msg_17);
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (err_mixed.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00550577;
    }
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_01139e30;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_c00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_bf8 = "";
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&err_mixed;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids,(lazy_ostream *)&submit_segwit_dedup,1,1,WARN,
               _cVar37,(size_t)&local_c00,0x2c3);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_01 = &submit_witness2.m_tx_results;
    cVar17 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&this_01->_M_t,
                    &((ptx_parent1.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    cVar18 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&this_01->_M_t,
                    &((ptx_parent2_v1.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    cVar19 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&this_01->_M_t,
                    &((ptx_parent3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    cVar20 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&this_01->_M_t,
                    &((ptx_mixed_child.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_witness_hash).m_wrapped);
    local_c10 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c08 = "";
    local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_18.m_end = (iterator)pPVar31;
    msg_18.m_begin = (iterator)pCVar27;
    file_18.m_end = (iterator)0x2ca;
    file_18.m_begin = (iterator)&local_c10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_c20,
               msg_18);
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = cVar17._M_node[2]._M_color == 2;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d90._0_8_ =
         "it_parent1->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY";
    local_d90.m_message.px = (element_type *)0xc63895;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_c30 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c28 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_d90;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               _cVar37,(size_t)&local_c30,0x2ca);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c40 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c38 = "";
    local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_19.m_end = pvVar30;
    msg_19.m_begin = pvVar26;
    file_19.m_end = (iterator)0x2cb;
    file_19.m_begin = (iterator)&local_c40;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_c50,
               msg_19);
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = cVar18._M_node[2]._M_color == 3;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d90._0_8_ =
         "it_parent2->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS";
    local_d90.m_message.px = (element_type *)0xc638ec;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_c60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c58 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_d90;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               _cVar37,(size_t)&local_c60,0x2cb);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c68 = "";
    local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_20.m_end = pvVar30;
    msg_20.m_begin = pvVar26;
    file_20.m_end = (iterator)0x2cc;
    file_20.m_begin = (iterator)&local_c70;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_c80,
               msg_20);
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = cVar19._M_node[2]._M_color == _S_red;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d90._0_8_ = "it_parent3->second.m_result_type == MempoolAcceptResult::ResultType::VALID";
    local_d90.m_message.px = (element_type *)0xc63937;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_c90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c88 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_d90;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               _cVar37,(size_t)&local_c90,0x2cc);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_ca0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c98 = "";
    local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_21.m_end = pvVar30;
    msg_21.m_begin = pvVar26;
    file_21.m_end = (iterator)0x2cd;
    file_21.m_begin = (iterator)&local_ca0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_cb0,
               msg_21);
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = cVar20._M_node[2]._M_color == _S_red;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d90._0_8_ = "it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID";
    local_d90.m_message.px = (element_type *)0xc63980;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_cc0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_cb8 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_d90;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               _cVar37,(size_t)&local_cc0,0x2cd);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_cd0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_cc8 = "";
    local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_22.m_end = pvVar30;
    msg_22.m_begin = pvVar26;
    file_22.m_end = (iterator)0x2ce;
    file_22.m_begin = (iterator)&local_cd0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_ce0,
               msg_22);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_01139f30;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
    local_cf0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ce8 = "";
    puVar21 = std::optional<uint256>::value((optional<uint256> *)&cVar18._M_node[7]._M_right);
    pWVar34 = &(ptx_parent2_v2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_witness_hash;
    pvVar26 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,uint256>
              (&submit_segwit_dedup,&local_cf0,0x2ce,1,2,pWVar34,0xc63981,puVar21,0xc639a2);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_mode = 100000000;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_result =
         PCKG_RESULT_UNSET;
    iVar15 = GetVirtualTransactionSize
                       (ptx_parent3.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar22 = GetVirtualTransactionSize
                       (ptx_mixed_child.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    CFeeRate::CFeeRate(&expected_feerate,(CAmount *)&submit_segwit_dedup,(int)iVar22 + (int)iVar15);
    local_d08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d00 = "";
    local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_23.m_end = (iterator)pWVar34;
    msg_23.m_begin = pvVar26;
    file_23.m_end = (iterator)0x2d2;
    file_23.m_begin = (iterator)&local_d08;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_d18,
               msg_23);
    pCVar23 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar19._M_node[6]._M_parent);
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ =
         pCVar23->nSatoshisPerK == expected_feerate.nSatoshisPerK;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d90._0_8_ = "it_parent3->second.m_effective_feerate.value() == expected_feerate";
    local_d90.m_message.px = (element_type *)0xc63a0d;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_d28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d20 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_d90;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               (check_type)puVar21,(size_t)&local_d28,0x2d2);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_d38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d30 = "";
    local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_24.m_end = pvVar30;
    msg_24.m_begin = pvVar26;
    file_24.m_end = (iterator)0x2d3;
    file_24.m_begin = (iterator)&local_d38;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_d48,
               msg_24);
    pCVar23 = std::optional<CFeeRate>::value((optional<CFeeRate> *)&cVar20._M_node[6]._M_parent);
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ =
         pCVar23->nSatoshisPerK == expected_feerate.nSatoshisPerK;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expected_wtxids.
    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d90._0_8_ = "it_child->second.m_effective_feerate.value() == expected_feerate";
    local_d90.m_message.px = (element_type *)0xc63a4e;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_d58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d50 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_d90;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&expected_wtxids,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,
               (check_type)puVar21,(size_t)&local_d58,0x2d3);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &expected_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         *(undefined8 *)
          ((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         *(pointer *)
          (((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length =
         *(size_type *)
          (((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity =
         *(undefined8 *)
          (((ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._8_8_ =
         *(undefined8 *)
          ((ptx_mixed_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
    _M_dataplus._M_p =
         *(pointer *)
          (((ptx_mixed_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
    _M_string_length =
         *(size_type *)
          (((ptx_mixed_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
    field_2._M_allocated_capacity =
         *(undefined8 *)
          (((ptx_mixed_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    __l_06._M_len = 2;
    __l_06._M_array = (iterator)&submit_segwit_dedup;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector(&expected_wtxids,__l_06,(allocator_type *)&local_d90);
    local_d68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d60 = "";
    local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_25.m_end = pvVar30;
    msg_25.m_begin = pvVar26;
    file_25.m_end = (iterator)0x2d5;
    file_25.m_begin = (iterator)&local_d68;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_d78,
               msg_25);
    pvVar24 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar19._M_node[6]._M_right);
    rVar10.super_class_property<bool>.value =
         (class_property<bool>)std::operator==(pvVar24,&expected_wtxids);
    local_d90.m_message.px = (element_type *)0x0;
    local_d90.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_da0 = "it_parent3->second.m_wtxids_fee_calculations.value() == expected_wtxids";
    local_d98 = "";
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_db0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_da8 = "";
    pvVar26 = &DAT_00000001;
    pvVar30 = (iterator)0x0;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_da0;
    local_d90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_d90,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,(check_type)puVar21,
               (size_t)&local_db0,0x2d5);
    boost::detail::shared_count::~shared_count(&local_d90.m_message.pn);
    local_dc0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_db8 = "";
    msg_26.m_end = pvVar30;
    msg_26.m_begin = pvVar26;
    file_26.m_end = (iterator)0x2d6;
    file_26.m_begin = (iterator)&local_dc0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
               (size_t)&stack0xfffffffffffff230,msg_26);
    pvVar24 = std::
              optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                       *)&cVar20._M_node[6]._M_right);
    local_d90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)std::operator==(pvVar24,&expected_wtxids);
    local_d90.m_message.px = (element_type *)0x0;
    local_d90.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_da0 = "it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids";
    local_d98 = "";
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_dataplus._M_p =
         submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p & 0xffffffffffffff00;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
         &PTR__lazy_ostream_0113a070;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    submit_segwit_dedup.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
    field_2._M_allocated_capacity = (size_type)&local_da0;
    boost::test_tools::tt_detail::report_assertion
              (&local_d90,(lazy_ostream *)&submit_segwit_dedup,1,0,WARN,(check_type)puVar21,
               (size_t)&stack0xfffffffffffff220,0x2d6);
    boost::detail::shared_count::~shared_count(&local_d90.m_message.pn);
    std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
    ::~_Vector_base(&expected_wtxids.
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   );
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&err_mixed);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult(&submit_witness2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_mixed_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_mixed_child);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&mixed_child_spk.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&mixed_grandchild_key.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_parent3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent3);
  MempoolAcceptResult::~MempoolAcceptResult(&parent2_v2_result);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_parent2_v2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_parent2_v1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent2_v2);
  CMutableTransaction::~CMutableTransaction(&mtx_parent2_v1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_grandparent2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_grandparent2);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&parent2_witness2.stack);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&parent2_witness1.stack);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&grandparent2_spk.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&grandparent2_script.super_CScriptBase);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_parent1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&acs_witness.stack);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&acs_spk.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&acs_script.super_CScriptBase);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_mixed);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_grandchild.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_grandchild);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&grandchild_locking_script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&grandchild_key.keydata);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_child2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_child1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_child2);
  CMutableTransaction::~CMutableTransaction(&mtx_child1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&child_locking_script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&child_key.keydata);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&witness2.stack);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&witness1.stack);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CMutableTransaction::~CMutableTransaction(&mtx_parent);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessScript.super_CScriptBase);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock18.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00550577:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_witness_swap_tests)
{
    // Mine blocks to mature coinbases.
    mineBlocks(5);
    MockMempoolMinFee(CFeeRate(5000));
    LOCK(cs_main);

    // Transactions with a same-txid-different-witness transaction in the mempool should be ignored,
    // and the mempool entry's wtxid returned.
    CScript witnessScript = CScript() << OP_DROP << OP_TRUE;
    CScript scriptPubKey = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/scriptPubKey,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef ptx_parent = MakeTransactionRef(mtx_parent);

    // Make two children with the same txid but different witnesses.
    CScriptWitness witness1;
    witness1.stack.emplace_back(1);
    witness1.stack.emplace_back(witnessScript.begin(), witnessScript.end());

    CScriptWitness witness2(witness1);
    witness2.stack.emplace_back(2);
    witness2.stack.emplace_back(witnessScript.begin(), witnessScript.end());

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CMutableTransaction mtx_child1;
    mtx_child1.version = 1;
    mtx_child1.vin.resize(1);
    mtx_child1.vin[0].prevout.hash = ptx_parent->GetHash();
    mtx_child1.vin[0].prevout.n = 0;
    mtx_child1.vin[0].scriptSig = CScript();
    mtx_child1.vin[0].scriptWitness = witness1;
    mtx_child1.vout.resize(1);
    mtx_child1.vout[0].nValue = CAmount(48 * COIN);
    mtx_child1.vout[0].scriptPubKey = child_locking_script;

    CMutableTransaction mtx_child2{mtx_child1};
    mtx_child2.vin[0].scriptWitness = witness2;

    CTransactionRef ptx_child1 = MakeTransactionRef(mtx_child1);
    CTransactionRef ptx_child2 = MakeTransactionRef(mtx_child2);

    // child1 and child2 have the same txid
    BOOST_CHECK_EQUAL(ptx_child1->GetHash(), ptx_child2->GetHash());
    // child1 and child2 have different wtxids
    BOOST_CHECK(ptx_child1->GetWitnessHash() != ptx_child2->GetWitnessHash());
    // Check that they have different package hashes
    BOOST_CHECK(GetPackageHash({ptx_parent, ptx_child1}) != GetPackageHash({ptx_parent, ptx_child2}));

    // Try submitting Package1{parent, child1} and Package2{parent, child2} where the children are
    // same-txid-different-witness.
    {
        Package package_parent_child1{ptx_parent, ptx_child1};
        const auto submit_witness1 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                       package_parent_child1, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_witness1{CheckPackageMempoolAcceptResult(package_parent_child1, submit_witness1, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_witness1.value());
        }

        // Child2 would have been validated individually.
        Package package_parent_child2{ptx_parent, ptx_child2};
        const auto submit_witness2 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                       package_parent_child2, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_witness2{CheckPackageMempoolAcceptResult(package_parent_child2, submit_witness2, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_witness2.value());
        } else {
            auto it_parent2_deduped = submit_witness2.m_tx_results.find(ptx_parent->GetWitnessHash());
            auto it_child2 = submit_witness2.m_tx_results.find(ptx_child2->GetWitnessHash());
            BOOST_CHECK(it_parent2_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child2->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK_EQUAL(ptx_child1->GetWitnessHash(), it_child2->second.m_other_wtxid.value());
        }

        // Deduplication should work when wtxid != txid. Submit package with the already-in-mempool
        // transactions again, which should not fail.
        const auto submit_segwit_dedup = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                           package_parent_child1, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_segwit_dedup{CheckPackageMempoolAcceptResult(package_parent_child1, submit_segwit_dedup, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_segwit_dedup.value());
        } else {
            auto it_parent_dup = submit_segwit_dedup.m_tx_results.find(ptx_parent->GetWitnessHash());
            auto it_child_dup = submit_segwit_dedup.m_tx_results.find(ptx_child1->GetWitnessHash());
            BOOST_CHECK(it_parent_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        }
    }

    // Try submitting Package1{child2, grandchild} where child2 is same-txid-different-witness as
    // the in-mempool transaction, child1. Since child1 exists in the mempool and its outputs are
    // available, child2 should be ignored and grandchild should be accepted.
    //
    // This tests a potential censorship vector in which an attacker broadcasts a competing package
    // where a parent's witness is mutated. The honest package should be accepted despite the fact
    // that we don't allow witness replacement.
    CKey grandchild_key = GenerateRandomKey();
    CScript grandchild_locking_script = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));
    auto mtx_grandchild = CreateValidMempoolTransaction(/*input_transaction=*/ptx_child2, /*input_vout=*/0,
                                                        /*input_height=*/0, /*input_signing_key=*/child_key,
                                                        /*output_destination=*/grandchild_locking_script,
                                                        /*output_amount=*/CAmount(47 * COIN), /*submit=*/false);
    CTransactionRef ptx_grandchild = MakeTransactionRef(mtx_grandchild);
    // Check that they have different package hashes
    BOOST_CHECK(GetPackageHash({ptx_child1, ptx_grandchild}) != GetPackageHash({ptx_child2, ptx_grandchild}));
    // We already submitted child1 above.
    {
        Package package_child2_grandchild{ptx_child2, ptx_grandchild};
        const auto submit_spend_ignored = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                            package_child2_grandchild, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_spend_ignored{CheckPackageMempoolAcceptResult(package_child2_grandchild, submit_spend_ignored, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_spend_ignored.value());
        } else {
            auto it_child2_ignored = submit_spend_ignored.m_tx_results.find(ptx_child2->GetWitnessHash());
            auto it_grandchild = submit_spend_ignored.m_tx_results.find(ptx_grandchild->GetWitnessHash());
            BOOST_CHECK(it_child2_ignored->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK(it_grandchild->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
        }
    }

    // A package Package{parent1, parent2, parent3, child} where the parents are a mixture of
    // identical-tx-in-mempool, same-txid-different-witness-in-mempool, and new transactions.
    Package package_mixed;

    // Give all the parents anyone-can-spend scripts so we don't have to deal with signing the child.
    CScript acs_script = CScript() << OP_TRUE;
    CScript acs_spk = GetScriptForDestination(WitnessV0ScriptHash(acs_script));
    CScriptWitness acs_witness;
    acs_witness.stack.emplace_back(acs_script.begin(), acs_script.end());

    // parent1 will already be in the mempool
    auto mtx_parent1 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[1], /*input_vout=*/0,
                                                     /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                     /*output_destination=*/acs_spk,
                                                     /*output_amount=*/CAmount(49 * COIN), /*submit=*/true);
    CTransactionRef ptx_parent1 = MakeTransactionRef(mtx_parent1);
    package_mixed.push_back(ptx_parent1);

    // parent2 will have a same-txid-different-witness tx already in the mempool
    CScript grandparent2_script = CScript() << OP_DROP << OP_TRUE;
    CScript grandparent2_spk = GetScriptForDestination(WitnessV0ScriptHash(grandparent2_script));
    CScriptWitness parent2_witness1;
    parent2_witness1.stack.emplace_back(1);
    parent2_witness1.stack.emplace_back(grandparent2_script.begin(), grandparent2_script.end());
    CScriptWitness parent2_witness2;
    parent2_witness2.stack.emplace_back(2);
    parent2_witness2.stack.emplace_back(grandparent2_script.begin(), grandparent2_script.end());

    // Create grandparent2 creating an output with multiple spending paths. Submit to mempool.
    auto mtx_grandparent2 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[2], /*input_vout=*/0,
                                                          /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                          /*output_destination=*/grandparent2_spk,
                                                          /*output_amount=*/CAmount(49 * COIN), /*submit=*/true);
    CTransactionRef ptx_grandparent2 = MakeTransactionRef(mtx_grandparent2);

    CMutableTransaction mtx_parent2_v1;
    mtx_parent2_v1.version = 1;
    mtx_parent2_v1.vin.resize(1);
    mtx_parent2_v1.vin[0].prevout.hash = ptx_grandparent2->GetHash();
    mtx_parent2_v1.vin[0].prevout.n = 0;
    mtx_parent2_v1.vin[0].scriptSig = CScript();
    mtx_parent2_v1.vin[0].scriptWitness = parent2_witness1;
    mtx_parent2_v1.vout.resize(1);
    mtx_parent2_v1.vout[0].nValue = CAmount(48 * COIN);
    mtx_parent2_v1.vout[0].scriptPubKey = acs_spk;

    CMutableTransaction mtx_parent2_v2{mtx_parent2_v1};
    mtx_parent2_v2.vin[0].scriptWitness = parent2_witness2;

    CTransactionRef ptx_parent2_v1 = MakeTransactionRef(mtx_parent2_v1);
    CTransactionRef ptx_parent2_v2 = MakeTransactionRef(mtx_parent2_v2);
    // Put parent2_v1 in the package, submit parent2_v2 to the mempool.
    const MempoolAcceptResult parent2_v2_result = m_node.chainman->ProcessTransaction(ptx_parent2_v2);
    BOOST_CHECK(parent2_v2_result.m_result_type == MempoolAcceptResult::ResultType::VALID);
    package_mixed.push_back(ptx_parent2_v1);

    // parent3 will be a new transaction. Put a low feerate to make it invalid on its own.
    auto mtx_parent3 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[3], /*input_vout=*/0,
                                                     /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                     /*output_destination=*/acs_spk,
                                                     /*output_amount=*/CAmount(50 * COIN - low_fee_amt), /*submit=*/false);
    CTransactionRef ptx_parent3 = MakeTransactionRef(mtx_parent3);
    package_mixed.push_back(ptx_parent3);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*ptx_parent3)) > low_fee_amt);
    BOOST_CHECK(m_node.mempool->m_opts.min_relay_feerate.GetFee(GetVirtualTransactionSize(*ptx_parent3)) <= low_fee_amt);

    // child spends parent1, parent2, and parent3
    CKey mixed_grandchild_key = GenerateRandomKey();
    CScript mixed_child_spk = GetScriptForDestination(WitnessV0KeyHash(mixed_grandchild_key.GetPubKey()));

    CMutableTransaction mtx_mixed_child;
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent1->GetHash(), 0));
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent2_v1->GetHash(), 0));
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent3->GetHash(), 0));
    mtx_mixed_child.vin[0].scriptWitness = acs_witness;
    mtx_mixed_child.vin[1].scriptWitness = acs_witness;
    mtx_mixed_child.vin[2].scriptWitness = acs_witness;
    mtx_mixed_child.vout.emplace_back((48 + 49 + 50 - 1) * COIN, mixed_child_spk);
    CTransactionRef ptx_mixed_child = MakeTransactionRef(mtx_mixed_child);
    package_mixed.push_back(ptx_mixed_child);

    // Submit package:
    // parent1 should be ignored
    // parent2_v1 should be ignored (and v2 wtxid returned)
    // parent3 should be accepted
    // child should be accepted
    {
        const auto mixed_result = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_mixed, false, /*client_maxfeerate=*/{});
        if (auto err_mixed{CheckPackageMempoolAcceptResult(package_mixed, mixed_result, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_mixed.value());
        } else {
            auto it_parent1 = mixed_result.m_tx_results.find(ptx_parent1->GetWitnessHash());
            auto it_parent2 = mixed_result.m_tx_results.find(ptx_parent2_v1->GetWitnessHash());
            auto it_parent3 = mixed_result.m_tx_results.find(ptx_parent3->GetWitnessHash());
            auto it_child = mixed_result.m_tx_results.find(ptx_mixed_child->GetWitnessHash());

            BOOST_CHECK(it_parent1->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_parent2->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK(it_parent3->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK_EQUAL(ptx_parent2_v2->GetWitnessHash(), it_parent2->second.m_other_wtxid.value());

            // package feerate should include parent3 and child. It should not include parent1 or parent2_v1.
            const CFeeRate expected_feerate(1 * COIN, GetVirtualTransactionSize(*ptx_parent3) + GetVirtualTransactionSize(*ptx_mixed_child));
            BOOST_CHECK(it_parent3->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({ptx_parent3->GetWitnessHash(), ptx_mixed_child->GetWitnessHash()});
            BOOST_CHECK(it_parent3->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
        }
    }
}